

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::VAOTest::initProgramObject(VAOTest *this)

{
  GLuint GVar1;
  GLenum GVar2;
  GLint GVar3;
  TestError *this_00;
  char *vs_code;
  uint n_xfb_varyings;
  char *xfb_varyings [7];
  VAOTest *this_local;
  
  xfb_varyings[6] = (char *)this;
  GVar1 = (*(this->super_Base).gl.createProgram)();
  this->m_po_id = GVar1;
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe0c);
  memcpy(&stack0xffffffffffffffb8,&PTR_anon_var_dwarf_2b998a_03247dd0,0x38);
  (*(this->super_Base).gl.transformFeedbackVaryings)
            (this->m_po_id,7,(GLchar **)&stack0xffffffffffffffb8,0x8c8c);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe14);
  this->m_xfb_bo1_dmat3_offset = 0;
  this->m_xfb_bo1_dmat3_size = 0x48;
  this->m_xfb_bo1_double_offset = this->m_xfb_bo1_dmat3_offset + this->m_xfb_bo1_dmat3_size;
  this->m_xfb_bo1_double_size = 8;
  this->m_xfb_bo1_int_offset = this->m_xfb_bo1_double_offset + this->m_xfb_bo1_double_size;
  this->m_xfb_bo1_int_size = 4;
  this->m_xfb_bo1_dvec2_offset = this->m_xfb_bo1_int_offset + this->m_xfb_bo1_int_size;
  this->m_xfb_bo1_dvec2_size = 0x10;
  this->m_xfb_bo1_float2_offset = this->m_xfb_bo1_dvec2_offset + this->m_xfb_bo1_dvec2_size;
  this->m_xfb_bo1_float2_size = 4;
  this->m_xfb_bo2_dmat4x2_offset = this->m_xfb_bo1_float2_offset + this->m_xfb_bo1_float2_size;
  this->m_xfb_bo2_dmat4x2_size = 0x40;
  this->m_xfb_bo2_float_offset = this->m_xfb_bo2_dmat4x2_offset + this->m_xfb_bo2_dmat4x2_size;
  this->m_xfb_bo2_float_size = 4;
  this->m_xfb_total_size =
       this->m_xfb_bo1_dmat3_size + this->m_xfb_bo1_double_size + this->m_xfb_bo1_int_size +
       this->m_xfb_bo1_dvec2_size + this->m_xfb_bo1_float2_size + this->m_xfb_bo2_dmat4x2_size +
       this->m_xfb_bo2_float_size;
  Base::BuildProgramVSOnly
            (&this->super_Base,this->m_po_id,
             "#version 400\n\n#extension GL_ARB_vertex_attrib_64bit : require\n\nin dmat3   in_bo1_dmat3;\nin double  in_bo1_double;\nin dvec2   in_bo1_dvec2;\nin float   in_bo1_float2;\nin int     in_bo1_int;\nin dmat4x2 in_bo2_dmat4x2;\nin float   in_bo2_float;\n\nout dmat3   out_bo1_dmat3;\nout double  out_bo1_double;\nout dvec2   out_bo1_dvec2;\nout float   out_bo1_float2;\nout int     out_bo1_int;\nout dmat4x2 out_bo2_dmat4x2;\nout float   out_bo2_float;\n\nvoid main()\n{\n    out_bo1_dmat3   = in_bo1_dmat3;\n    out_bo1_double  = in_bo1_double;\n    out_bo1_dvec2   = in_bo1_dvec2;\n    out_bo1_int     = in_bo1_int;\n    out_bo1_float2  = in_bo1_float2;\n    out_bo2_dmat4x2 = in_bo2_dmat4x2;\n    out_bo2_float   = in_bo2_float;\n}\n"
             ,&this->m_vs_id);
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo1_dmat3");
  this->m_po_bo1_dmat3_attr_location = GVar3;
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo1_double");
  this->m_po_bo1_double_attr_location = GVar3;
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo1_dvec2");
  this->m_po_bo1_dvec2_attr_location = GVar3;
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo1_float2");
  this->m_po_bo1_float2_attr_location = GVar3;
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo1_int");
  this->m_po_bo1_int_attr_location = GVar3;
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo2_dmat4x2");
  this->m_po_bo2_dmat4x2_attr_location = GVar3;
  GVar3 = (*(this->super_Base).gl.getAttribLocation)(this->m_po_id,"in_bo2_float");
  this->m_po_bo2_float_attr_location = GVar3;
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glGetAttribLocation() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe51);
  if ((((this->m_po_bo1_dmat3_attr_location != -1) && (this->m_po_bo1_double_attr_location != -1))
      && (this->m_po_bo1_dvec2_attr_location != -1)) &&
     (((this->m_po_bo1_int_attr_location != -1 && (this->m_po_bo1_float2_attr_location != -1)) &&
      ((this->m_po_bo2_dmat4x2_attr_location != -1 && (this->m_po_bo2_float_attr_location != -1)))))
     ) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"At least one attribute is considered inactive which is invalid.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
             ,0xe57);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void VAOTest::initProgramObject()
{
	DE_ASSERT(m_po_id == 0);
	DE_ASSERT(m_vs_id == 0);

	/* Generate a program object */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Configure XFB */
	const char* xfb_varyings[] = { "out_bo1_dmat3",  "out_bo1_double",  "out_bo1_int",  "out_bo1_dvec2",
								   "out_bo1_float2", "out_bo2_dmat4x2", "out_bo2_float" };
	const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);

	gl.transformFeedbackVaryings(m_po_id, n_xfb_varyings, xfb_varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Initialize XFB-specific offset information for the verification routine */
	m_xfb_bo1_dmat3_offset   = 0;
	m_xfb_bo1_dmat3_size	 = sizeof(double) * 3 * 3;
	m_xfb_bo1_double_offset  = m_xfb_bo1_dmat3_offset + m_xfb_bo1_dmat3_size;
	m_xfb_bo1_double_size	= sizeof(double);
	m_xfb_bo1_int_offset	 = m_xfb_bo1_double_offset + m_xfb_bo1_double_size;
	m_xfb_bo1_int_size		 = sizeof(int);
	m_xfb_bo1_dvec2_offset   = m_xfb_bo1_int_offset + m_xfb_bo1_int_size;
	m_xfb_bo1_dvec2_size	 = sizeof(double) * 2;
	m_xfb_bo1_float2_offset  = m_xfb_bo1_dvec2_offset + m_xfb_bo1_dvec2_size;
	m_xfb_bo1_float2_size	= sizeof(float);
	m_xfb_bo2_dmat4x2_offset = m_xfb_bo1_float2_offset + m_xfb_bo1_float2_size;
	m_xfb_bo2_dmat4x2_size   = sizeof(double) * 4 * 2;
	m_xfb_bo2_float_offset   = m_xfb_bo2_dmat4x2_offset + m_xfb_bo2_dmat4x2_size;
	m_xfb_bo2_float_size	 = sizeof(float);
	m_xfb_total_size = m_xfb_bo1_dmat3_size + m_xfb_bo1_double_size + m_xfb_bo1_int_size + m_xfb_bo1_dvec2_size +
					   m_xfb_bo1_float2_size + m_xfb_bo2_dmat4x2_size + m_xfb_bo2_float_size;

	/* Build the test program object */
	const char* vs_code = "#version 400\n"
						  "\n"
						  "#extension GL_ARB_vertex_attrib_64bit : require\n"
						  "\n"
						  "in dmat3   in_bo1_dmat3;\n"
						  "in double  in_bo1_double;\n"
						  "in dvec2   in_bo1_dvec2;\n"
						  "in float   in_bo1_float2;\n"
						  "in int     in_bo1_int;\n"
						  "in dmat4x2 in_bo2_dmat4x2;\n"
						  "in float   in_bo2_float;\n"
						  "\n"
						  "out dmat3   out_bo1_dmat3;\n"
						  "out double  out_bo1_double;\n"
						  "out dvec2   out_bo1_dvec2;\n"
						  "out float   out_bo1_float2;\n"
						  "out int     out_bo1_int;\n"
						  "out dmat4x2 out_bo2_dmat4x2;\n"
						  "out float   out_bo2_float;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    out_bo1_dmat3   = in_bo1_dmat3;\n"
						  "    out_bo1_double  = in_bo1_double;\n"
						  "    out_bo1_dvec2   = in_bo1_dvec2;\n"
						  "    out_bo1_int     = in_bo1_int;\n"
						  "    out_bo1_float2  = in_bo1_float2;\n"
						  "    out_bo2_dmat4x2 = in_bo2_dmat4x2;\n"
						  "    out_bo2_float   = in_bo2_float;\n"
						  "}\n";

	BuildProgramVSOnly(m_po_id, vs_code, m_vs_id);

	m_po_bo1_dmat3_attr_location   = gl.getAttribLocation(m_po_id, "in_bo1_dmat3");
	m_po_bo1_double_attr_location  = gl.getAttribLocation(m_po_id, "in_bo1_double");
	m_po_bo1_dvec2_attr_location   = gl.getAttribLocation(m_po_id, "in_bo1_dvec2");
	m_po_bo1_float2_attr_location  = gl.getAttribLocation(m_po_id, "in_bo1_float2");
	m_po_bo1_int_attr_location	 = gl.getAttribLocation(m_po_id, "in_bo1_int");
	m_po_bo2_dmat4x2_attr_location = gl.getAttribLocation(m_po_id, "in_bo2_dmat4x2");
	m_po_bo2_float_attr_location   = gl.getAttribLocation(m_po_id, "in_bo2_float");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation() call(s) failed.");

	if (m_po_bo1_dmat3_attr_location == -1 || m_po_bo1_double_attr_location == -1 ||
		m_po_bo1_dvec2_attr_location == -1 || m_po_bo1_int_attr_location == -1 || m_po_bo1_float2_attr_location == -1 ||
		m_po_bo2_dmat4x2_attr_location == -1 || m_po_bo2_float_attr_location == -1)
	{
		TCU_FAIL("At least one attribute is considered inactive which is invalid.");
	}
}